

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,slang::syntax::MacroActualArgumentSyntax_const&>
          (BumpAllocator *this,MacroActualArgumentSyntax *args)

{
  MacroActualArgumentSyntax *pMVar1;
  MacroActualArgumentSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pMVar1 = (MacroActualArgumentSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::MacroActualArgumentSyntax::MacroActualArgumentSyntax(in_RSI,pMVar1);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }